

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

ray * __thiscall camera::get_ray(ray *__return_storage_ptr__,camera *this,double s,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar1 = this->lens_radius;
  do {
    iVar13 = rand();
    dVar16 = (double)iVar13 * 4.656612873077393e-10 + (double)iVar13 * 4.656612873077393e-10 + -1.0;
    iVar13 = rand();
    dVar14 = (double)iVar13 * 4.656612873077393e-10 + (double)iVar13 * 4.656612873077393e-10 + -1.0;
  } while (1.0 <= dVar16 * dVar16 + dVar14 * dVar14);
  dVar16 = dVar16 * dVar1;
  dVar14 = dVar14 * dVar1;
  dVar18 = (this->v).e[0] * dVar14 + (this->u).e[0] * dVar16;
  dVar17 = (this->v).e[1] * dVar14 + (this->u).e[1] * dVar16;
  dVar15 = dVar14 * (this->v).e[2] + dVar16 * (this->u).e[2];
  dVar1 = (this->origin).e[0];
  dVar14 = (this->origin).e[1];
  dVar16 = (this->horizontal).e[0];
  dVar2 = (this->lower_left_corner).e[0];
  dVar3 = (this->vertical).e[0];
  dVar4 = (this->horizontal).e[1];
  dVar5 = (this->lower_left_corner).e[1];
  dVar6 = (this->vertical).e[1];
  dVar7 = (this->origin).e[2];
  dVar8 = (this->horizontal).e[2];
  dVar9 = (this->lower_left_corner).e[2];
  dVar10 = (this->vertical).e[2];
  dVar11 = this->time0;
  dVar12 = this->time1;
  iVar13 = rand();
  (__return_storage_ptr__->orig).e[0] = dVar18 + dVar1;
  (__return_storage_ptr__->orig).e[1] = dVar17 + dVar14;
  (__return_storage_ptr__->orig).e[2] = dVar15 + dVar7;
  (__return_storage_ptr__->dir).e[0] = ((dVar3 * t + dVar16 * s + dVar2) - dVar1) - dVar18;
  (__return_storage_ptr__->dir).e[1] = ((dVar6 * t + dVar4 * s + dVar5) - dVar14) - dVar17;
  (__return_storage_ptr__->dir).e[2] = ((t * dVar10 + s * dVar8 + dVar9) - dVar7) - dVar15;
  __return_storage_ptr__->tm = (double)iVar13 * 4.656612873077393e-10 * (dVar12 - dVar11) + dVar11;
  return __return_storage_ptr__;
}

Assistant:

ray get_ray(double s, double t) {
        vec3 rd = lens_radius * random_in_unit_disk();
        vec3 offset = u * rd.x() + v * rd.y();

        return ray(
                origin + offset,
                lower_left_corner + s * horizontal + t * vertical - origin - offset,
                random_double(time0, time1)
                );
    }